

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::ShaderExtensionTestCase::iterate(ShaderExtensionTestCase *this)

{
  undefined *__s;
  bool bVar1;
  int iVar2;
  ContextInfo *this_00;
  char *name;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  GLchar *text;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  ShaderInfo *pSVar5;
  char *local_3a8;
  MessageBuilder local_3a0;
  undefined1 local_220 [8];
  ShaderProgram program;
  undefined1 local_128 [8];
  ProgramSources sources;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string shader;
  Functions *gl;
  ShaderExtensionTestCase *this_local;
  
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  name = (char *)std::__cxx11::string::c_str();
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,name);
  if (bVar1) {
    pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    __s = st2_compute_extensionCheck;
    shader.field_2._8_8_ = CONCAT44(extraout_var,iVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,__s,&local_41);
    std::allocator<char>::~allocator(&local_41);
    text = (GLchar *)std::__cxx11::string::c_str();
    replaceToken("<EXTENSION>",text,(string *)local_40);
    glu::ProgramSources::ProgramSources((ProgramSources *)local_128);
    glu::ComputeSource::ComputeSource
              ((ComputeSource *)&program.m_program.m_info.linkTimeUs,(string *)local_40);
    glu::ProgramSources::operator<<
              ((ProgramSources *)local_128,(ShaderSource *)&program.m_program.m_info.linkTimeUs);
    glu::ComputeSource::~ComputeSource((ComputeSource *)&program.m_program.m_info.linkTimeUs);
    glu::ShaderProgram::ShaderProgram
              ((ShaderProgram *)local_220,(Functions *)shader.field_2._8_8_,
               (ProgramSources *)local_128);
    bVar1 = glu::ShaderProgram::isOk((ShaderProgram *)local_220);
    if (bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
      this_01 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_3a0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (&local_3a0,
                          (char (*) [57])"Checking shader preprocessor directives failed. Source:\n"
                         );
      local_3a8 = (char *)std::__cxx11::string::c_str();
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_3a8);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [10])"InfoLog:\n");
      pSVar5 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_220,SHADERTYPE_COMPUTE,0);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&pSVar5->infoLog);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b9e07b);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3a0);
    }
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_220);
    glu::ProgramSources::~ProgramSources((ProgramSources *)local_128);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ShaderExtensionTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported(mExtension.c_str()))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	std::string shader = st2_compute_extensionCheck;
	replaceToken("<EXTENSION>", mExtension.c_str(), shader);

	ProgramSources sources;
	sources << ComputeSource(shader);
	ShaderProgram program(gl, sources);

	if (!program.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		m_testCtx.getLog() << tcu::TestLog::Message << "Checking shader preprocessor directives failed. Source:\n"
						   << shader.c_str() << "InfoLog:\n"
						   << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog << "\n"
						   << tcu::TestLog::EndMessage;
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}